

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::extMul<8ul,unsigned_char,unsigned_short,(wasm::LaneOrder)1>
          (Literal *__return_storage_ptr__,wasm *this,Literal *a,Literal *b)

{
  uint uVar1;
  uint uVar2;
  reference pvVar3;
  reference this_00;
  Literal *val;
  Literal local_418;
  size_type local_400;
  size_t idx;
  size_t i;
  LaneArray<8UL> result;
  undefined1 local_320 [8];
  LaneArray<8UL_*_2> rhs;
  LaneArray<8UL_*_2> lhs;
  Literal *b_local;
  Literal *a_local;
  
  getLanes<unsigned_char,16>((LaneArray<16> *)&rhs._M_elems[0xf].type,this,a);
  getLanes<unsigned_char,16>((LaneArray<16> *)local_320,(wasm *)a,val);
  std::array<wasm::Literal,_8UL>::array((array<wasm::Literal,_8UL> *)&i);
  for (idx = 0; idx < 8; idx = idx + 1) {
    local_400 = idx + 8;
    pvVar3 = std::array<wasm::Literal,_16UL>::operator[]
                       ((array<wasm::Literal,_16UL> *)&rhs._M_elems[0xf].type,local_400);
    uVar1 = Literal::geti32(pvVar3);
    pvVar3 = std::array<wasm::Literal,_16UL>::operator[]
                       ((array<wasm::Literal,_16UL> *)local_320,local_400);
    uVar2 = Literal::geti32(pvVar3);
    Literal::Literal(&local_418,(uVar1 & 0xff) * (uVar2 & 0xff));
    this_00 = std::array<wasm::Literal,_8UL>::operator[]((array<wasm::Literal,_8UL> *)&i,idx);
    Literal::operator=(this_00,&local_418);
    Literal::~Literal(&local_418);
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<8> *)&i);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&i);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_320);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)&rhs._M_elems[0xf].type);
  return __return_storage_ptr__;
}

Assistant:

Literal extMul(const Literal& a, const Literal& b) {
  LaneArray<Lanes* 2> lhs = getLanes<LaneFrom, Lanes * 2>(a);
  LaneArray<Lanes* 2> rhs = getLanes<LaneFrom, Lanes * 2>(b);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lhs[idx].geti32() *
                        (LaneTo)(LaneFrom)rhs[idx].geti32());
  }
  return Literal(result);
}